

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O3

Result __thiscall
wabt::anon_unknown_15::BinaryReaderIR::BeginDataSegmentInitExpr(BinaryReaderIR *this,Index index)

{
  pointer ppDVar1;
  Result RVar2;
  
  ppDVar1 = (this->module_->data_segments).
            super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (((long)(this->module_->data_segments).
             super__Vector_base<wabt::DataSegment_*,_std::allocator<wabt::DataSegment_*>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)ppDVar1 >> 3) - 1U == (ulong)index) {
    RVar2 = PushLabel(this,InitExpr,&ppDVar1[index]->offset,(Expr *)0x0);
    return (Result)RVar2.enum_;
  }
  __assert_fail("index == module_->data_segments.size() - 1",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/binary-reader-ir.cc"
                ,0x5bd,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::BeginDataSegmentInitExpr(Index)"
               );
}

Assistant:

Result BinaryReaderIR::BeginDataSegmentInitExpr(Index index) {
  assert(index == module_->data_segments.size() - 1);
  DataSegment* segment = module_->data_segments[index];
  return BeginInitExpr(&segment->offset);
}